

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::createCaseGroup
               (TestCaseGroup *parent,char *groupName,char *groupDesc,TexFuncCaseSpec *cases,
               int numCases)

{
  char *__s;
  bool bVar1;
  TestCaseGroup *this;
  TestContext *pTVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  ShaderTextureFunctionCase *pSVar5;
  long lVar6;
  bool local_202;
  allocator<char> local_1d9;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_192;
  allocator<char> local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e2;
  allocator<char> local_e1;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  bool local_7a;
  allocator<char> local_79;
  undefined1 local_78 [6];
  bool sparseSupported;
  string name;
  DefaultDeleter<tcu::TestCaseGroup> local_4d;
  int ndx;
  undefined1 local_40 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  int numCases_local;
  TexFuncCaseSpec *cases_local;
  char *groupDesc_local;
  char *groupName_local;
  TestCaseGroup *parent_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._12_4_
       = numCases;
  this = (TestCaseGroup *)operator_new(0x70);
  pTVar2 = tcu::TestNode::getTestContext(&parent->super_TestNode);
  tcu::TestCaseGroup::TestCaseGroup(this,pTVar2,groupName,groupDesc);
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_4d);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40,this);
  for (name.field_2._12_4_ = 0;
      (int)name.field_2._12_4_ <
      (int)group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
           m_data._12_4_; name.field_2._12_4_ = name.field_2._12_4_ + 1) {
    __s = cases[(int)name.field_2._12_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_78,__s,&local_79);
    std::allocator<char>::~allocator(&local_79);
    bVar1 = functionHasProj(cases[(int)name.field_2._12_4_].lookupSpec.function);
    local_202 = false;
    if (((!bVar1) &&
        (local_202 = false, cases[(int)name.field_2._12_4_].texSpec.type != TEXTURETYPE_1D)) &&
       (local_202 = false, cases[(int)name.field_2._12_4_].texSpec.type != TEXTURETYPE_1D_ARRAY)) {
      local_202 = cases[(int)name.field_2._12_4_].texSpec.type != TEXTURETYPE_CUBE_ARRAY;
    }
    local_7a = local_202;
    if ((cases[(int)name.field_2._12_4_].flags & 1) != 0) {
      if (local_202 != false) {
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_40)->super_TestNode;
        pTVar4 = (TestNode *)operator_new(0x1d8);
        local_e2 = 1;
        pTVar2 = tcu::TestNode::getTestContext(&parent->super_TestNode);
        std::operator+(&local_c0,"sparse_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::operator+(&local_a0,&local_c0,"_vertex");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
        lVar6 = (long)(int)name.field_2._12_4_;
        SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                  ((SparseShaderTextureFunctionCase *)pTVar4,pTVar2,&local_a0,&local_e0,
                   &cases[lVar6].lookupSpec,&cases[lVar6].texSpec,cases[lVar6].evalFunc,true);
        local_e2 = 0;
        tcu::TestNode::addChild(pTVar3,pTVar4);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
      }
      pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_40)->super_TestNode;
      pSVar5 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
      local_12a = 1;
      pTVar2 = tcu::TestNode::getTestContext(&parent->super_TestNode);
      std::operator+(&local_108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     "_vertex");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
      lVar6 = (long)(int)name.field_2._12_4_;
      ShaderTextureFunctionCase::ShaderTextureFunctionCase
                (pSVar5,pTVar2,&local_108,&local_128,&cases[lVar6].lookupSpec,&cases[lVar6].texSpec,
                 cases[lVar6].evalFunc,true);
      local_12a = 0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar5);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      std::__cxx11::string::~string((string *)&local_108);
    }
    if ((cases[(int)name.field_2._12_4_].flags & 2) != 0) {
      if ((local_7a & 1U) != 0) {
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_40)->super_TestNode;
        pTVar4 = (TestNode *)operator_new(0x1d8);
        local_192 = 1;
        pTVar2 = tcu::TestNode::getTestContext(&parent->super_TestNode);
        std::operator+(&local_170,"sparse_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                      );
        std::operator+(&local_150,&local_170,"_fragment");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"",&local_191);
        lVar6 = (long)(int)name.field_2._12_4_;
        SparseShaderTextureFunctionCase::SparseShaderTextureFunctionCase
                  ((SparseShaderTextureFunctionCase *)pTVar4,pTVar2,&local_150,&local_190,
                   &cases[lVar6].lookupSpec,&cases[lVar6].texSpec,cases[lVar6].evalFunc,false);
        local_192 = 0;
        tcu::TestNode::addChild(pTVar3,pTVar4);
        std::__cxx11::string::~string((string *)&local_190);
        std::allocator<char>::~allocator(&local_191);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
      }
      pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_40)->super_TestNode;
      pSVar5 = (ShaderTextureFunctionCase *)operator_new(0x1d8);
      pTVar2 = tcu::TestNode::getTestContext(&parent->super_TestNode);
      std::operator+(&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     "_fragment");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"",&local_1d9);
      lVar6 = (long)(int)name.field_2._12_4_;
      ShaderTextureFunctionCase::ShaderTextureFunctionCase
                (pSVar5,pTVar2,&local_1b8,&local_1d8,&cases[lVar6].lookupSpec,&cases[lVar6].texSpec,
                 cases[lVar6].evalFunc,false);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar5);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40
                   )->super_TestNode;
  tcu::TestNode::addChild(&parent->super_TestNode,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_40);
  return;
}

Assistant:

static void createCaseGroup (tcu::TestCaseGroup* parent, const char* groupName, const char* groupDesc, const TexFuncCaseSpec* cases, int numCases)
{
	de::MovePtr<tcu::TestCaseGroup>	group	(new tcu::TestCaseGroup(parent->getTestContext(), groupName, groupDesc));

	for (int ndx = 0; ndx < numCases; ndx++)
	{
		std::string	name			= cases[ndx].name;
		bool		sparseSupported	= !functionHasProj(cases[ndx].lookupSpec.function)		&&
									  TEXTURETYPE_1D			!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_1D_ARRAY		!= cases[ndx].texSpec.type	&&
									  TEXTURETYPE_CUBE_ARRAY	!= cases[ndx].texSpec.type;

		if (cases[ndx].flags & VERTEX)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_vertex"),   "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, true ));
		}

		if (cases[ndx].flags & FRAGMENT)
		{
			if (sparseSupported)
				group->addChild(new SparseShaderTextureFunctionCase(parent->getTestContext(), ("sparse_" + name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));

			group->addChild(new ShaderTextureFunctionCase(parent->getTestContext(), (name + "_fragment"), "", cases[ndx].lookupSpec, cases[ndx].texSpec, cases[ndx].evalFunc, false));
		}
	}

	parent->addChild(group.release());
}